

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O2

void __thiscall LongReadsDatastore::print_status(LongReadsDatastore *this)

{
  pointer pRVar1;
  unsigned_long uVar2;
  pointer puVar3;
  ostream *poVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  int ri;
  ulong uVar8;
  pointer puVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> read_sizes;
  ulong local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_38;
  
  lVar10 = 0;
  poVar4 = sdglib::OutputLog(INFO,false);
  read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0x18;
  for (uVar8 = 1;
      pRVar1 = (this->read_to_fileRecord).
               super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar8 <= ((long)(this->read_to_fileRecord).
                      super__Vector_base<ReadPosSize,_std::allocator<ReadPosSize>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pRVar1 >> 4) - 1U; uVar8 = uVar8 + 1
      ) {
    uVar7 = (ulong)*(uint *)((long)&pRVar1->offset + lVar11);
    local_70 = uVar7;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&read_sizes,&local_70);
    lVar10 = lVar10 + uVar7;
    lVar11 = lVar11 + 0x10;
  }
  local_38.current._M_current =
       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        )(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          )read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_40.current._M_current =
       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        )(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          )read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::
  sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
            (&local_38,&local_40);
  poVar5 = sdglib::OutputLog(INFO,true);
  poVar5 = std::operator<<(poVar5,"The datastore on ");
  poVar5 = std::operator<<(poVar5,(string *)&this->filename);
  poVar5 = std::operator<<(poVar5," contains ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  poVar5 = std::operator<<(poVar5," reads with ");
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::operator<<(poVar5,"bp, ");
  puVar3 = read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
  auVar12._0_8_ = lVar10;
  auVar12._12_4_ = 0x45300000;
  dStack_60 = auVar12._8_8_ - 1.9342813113834067e+25;
  dVar17 = dStack_60 + ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0);
  local_68 = dVar17 * 0.8;
  lVar11 = 0;
  for (puVar9 = read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start; puVar9 != puVar3; puVar9 = puVar9 + 1) {
    uVar2 = *puVar9;
    if (lVar11 == 0) {
      poVar5 = std::operator<<(poVar4,"N0: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"bp  ");
    }
    auVar13._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar13._0_8_ = lVar11;
    auVar13._12_4_ = 0x45300000;
    dStack_50 = auVar13._8_8_ - 1.9342813113834067e+25;
    local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
    if ((local_58 < dVar17 * 0.2) &&
       (lVar6 = uVar2 + lVar11, auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20), auVar14._0_8_ = lVar6,
       auVar14._12_4_ = 0x45300000,
       dVar17 * 0.2 <
       (auVar14._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) {
      poVar5 = std::operator<<(poVar4,"N20: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"bp  ");
    }
    if ((local_58 < dVar17 * 0.5) &&
       (lVar6 = uVar2 + lVar11, auVar15._8_4_ = (int)((ulong)lVar6 >> 0x20), auVar15._0_8_ = lVar6,
       auVar15._12_4_ = 0x45300000,
       dVar17 * 0.5 <
       (auVar15._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) {
      poVar5 = std::operator<<(poVar4,"N50: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"bp  ");
    }
    lVar11 = lVar11 + uVar2;
    auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
    auVar16._0_8_ = lVar11;
    auVar16._12_4_ = 0x45300000;
    if ((local_58 < local_68) &&
       (local_68 <
        (auVar16._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0))) {
      poVar5 = std::operator<<(poVar4,"N80: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"bp  ");
    }
    if (lVar11 == lVar10) {
      poVar5 = std::operator<<(poVar4,"N100: ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"bp  ");
    }
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  LongReadsMapper::print_status(&this->mapper);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&read_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void LongReadsDatastore::print_status() const {
    auto &log_no_date=sdglib::OutputLog(sdglib::LogLevels::INFO,false);
    std::vector<uint64_t> read_sizes;
    uint64_t total_size=0;
    for (auto ri=1;ri<=size();++ri) {
        auto s=read_to_fileRecord[ri].record_size;
            total_size += s;
            read_sizes.push_back(s);
    }
    std::sort(read_sizes.rbegin(),read_sizes.rend());
    auto on20s=total_size*.2;
    auto on50s=total_size*.5;
    auto on80s=total_size*.8;
    sdglib::OutputLog() <<"The datastore on " << filename << " contains "<<read_sizes.size()<<" reads with "<<total_size<<"bp, ";
    uint64_t acc=0;
    for (auto s:read_sizes){
        if (acc==0)  log_no_date<<"N0: "<<s<<"bp  ";
        if (acc<on20s and acc+s>on20s) log_no_date<<"N20: "<<s<<"bp  ";
        if (acc<on50s and acc+s>on50s) log_no_date<<"N50: "<<s<<"bp  ";
        if (acc<on80s and acc+s>on80s) log_no_date<<"N80: "<<s<<"bp  ";
        acc+=s;
        if (acc==total_size)  log_no_date<<"N100: "<<s<<"bp  ";
    }
    log_no_date<<std::endl;

    mapper.print_status();
}